

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustach.c
# Opt level: O1

int fdmustach(char *template,mustach_itf *itf,void *closure,int fd)

{
  long lVar1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __stream = fdopen(fd,"w");
  if (__stream == (FILE *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0xc;
    iVar2 = -1;
  }
  else {
    if (itf->start == (_func_int_void_ptr *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = (*itf->start)(closure);
    }
    if (iVar2 == 0) {
      iVar2 = process(template,itf,closure,(FILE *)__stream,"{{","}}");
    }
    fclose(__stream);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int fdmustach(const char *template, struct mustach_itf *itf, void *closure, int fd)
{
	int rc;
	FILE *file;

	file = fdopen(fd, "w");
	if (file == NULL) {
		rc = MUSTACH_ERROR_SYSTEM;
		errno = ENOMEM;
	} else {
		rc = fmustach(template, itf, closure, file);
		fclose(file);
	}
	return rc;
}